

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

size_t __thiscall Corrade::Utility::Arguments::arrayValueCount(Arguments *this,string *key)

{
  Entry *pEVar1;
  Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
  *pAVar2;
  ostream *poVar3;
  Debug *pDVar4;
  Error local_48;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                 &this->_prefix,key);
  pEVar1 = find(this,(string *)&local_48);
  if (local_48.super_Debug._output != (ostream *)&local_48.super_Debug._sourceLocationFile) {
    operator_delete(local_48.super_Debug._output);
  }
  if (pEVar1 == (Entry *)0x0) {
    poVar3 = Error::defaultOutput();
    Error::Error(&local_48,poVar3,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_48.super_Debug,"Utility::Arguments::arrayValueCount(): key");
    pDVar4 = Implementation::debugPrintStlString(pDVar4,key);
    Debug::operator<<(pDVar4,"not found");
  }
  else if ((pEVar1->type == ArrayArgument) || (pEVar1->type == ArrayOption)) {
    if (pEVar1->id < (this->_arrayValues)._size) {
      if ((char)(this->_flags)._value < '\0') {
        pAVar2 = Containers::
                 Array<Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>,_void_(*)(Corrade::Containers::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>_*,_unsigned_long)>
                 ::operator[]<unsigned_long,_0>(&this->_arrayValues,pEVar1->id);
        return pAVar2->_size;
      }
      poVar3 = Error::defaultOutput();
      Error::Error(&local_48,poVar3,(Flags)0x0);
      Debug::operator<<(&local_48.super_Debug,
                        "Utility::Arguments::arrayValueCount(): arguments were not successfully parsed yet"
                       );
    }
    else {
      poVar3 = Error::defaultOutput();
      Error::Error(&local_48,poVar3,(Flags)0x0);
      Debug::operator<<(&local_48.super_Debug,
                        "Assertion found->id < _arrayValues.size() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:1132"
                       );
    }
  }
  else {
    poVar3 = Error::defaultOutput();
    Error::Error(&local_48,poVar3,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_48.super_Debug,
                               "Utility::Arguments::arrayValueCount(): cannot use this function for a non-array option"
                              );
    operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (pDVar4,key);
  }
  Error::~Error(&local_48);
  abort();
}

Assistant:

std::size_t Arguments::arrayValueCount(const std::string& key) const {
    const Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::arrayValueCount(): key" << key << "not found", {});
    CORRADE_ASSERT(found->type == Type::ArrayArgument || found->type == Type::ArrayOption,
        "Utility::Arguments::arrayValueCount(): cannot use this function for a non-array option" << key, {});
    CORRADE_INTERNAL_ASSERT(found->id < _arrayValues.size());
    CORRADE_ASSERT(_flags & InternalFlag::Parsed, "Utility::Arguments::arrayValueCount(): arguments were not successfully parsed yet", {});
    return _arrayValues[found->id].size();
}